

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gizmo.c
# Opt level: O2

void golf_gizmo_update(golf_gizmo_t *gizmo,ImDrawList *draw_list)

{
  golf_transform_t *pgVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float fVar14;
  undefined4 uVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  float fVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  float fVar29;
  undefined4 uVar30;
  float fVar31;
  golf_gizmo_operation gVar32;
  undefined8 uVar33;
  vec2 vVar34;
  ImVec4 col;
  ImVec4 col_00;
  ImVec4 col_01;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  vec3 plane_point;
  vec3 v2;
  vec3 v1;
  vec3 v2_00;
  vec3 v1_00;
  vec3 v2_01;
  vec3 v2_02;
  vec3 v2_03;
  vec3 v2_04;
  vec3 world_pos;
  vec3 v1_01;
  vec3 v2_05;
  vec3 v1_02;
  vec3 v1_03;
  vec3 v1_04;
  vec3 v1_05;
  vec3 v1_06;
  vec3 world_pos_00;
  vec3 world_pos_01;
  vec3 world_pos_02;
  golf_gizmo_t *pgVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  _Bool _Var38;
  ImU32 IVar39;
  golf_inputs_t *pgVar40;
  golf_graphics_t *pgVar41;
  uint uVar42;
  uint uVar43;
  int iVar44;
  ulong uVar45;
  ulong uVar46;
  vec3 *pvVar47;
  float *pfVar48;
  long lVar49;
  int i;
  float *pfVar50;
  float fVar51;
  float fVar52;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined4 extraout_XMM0_Dd_22;
  undefined4 extraout_XMM0_Dd_23;
  undefined4 extraout_XMM0_Dd_24;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined4 extraout_XMM0_Dd_35;
  undefined4 extraout_XMM0_Dd_36;
  undefined4 uVar53;
  undefined4 uVar54;
  vec3 vVar55;
  vec3 v;
  vec3 v1_07;
  vec3 p1;
  vec3 point;
  vec3 ro;
  vec3 v_00;
  vec3 v1_08;
  vec3 v1_09;
  vec3 v1_10;
  vec3 u;
  vec3 world_pos_03;
  vec3 world_pos_04;
  vec3 v1_11;
  vec3 u_00;
  vec3 vec;
  vec3 v_01;
  vec3 v1_12;
  vec3 p1_00;
  vec3 v1_13;
  vec3 v1_14;
  vec3 v_02;
  vec3 position;
  vec3 v1_15;
  vec3 vec_00;
  vec3 vec_01;
  vec3 vec_02;
  vec3 position_00;
  vec3 world_pos_05;
  vec3 v_03;
  vec3 v1_16;
  vec3 position_01;
  vec3 world_pos_06;
  vec3 v_04;
  vec3 v1_17;
  vec3 q1;
  vec3 rd;
  vec3 q1_00;
  vec3 scale;
  vec3 scale_00;
  vec3 scale_01;
  quat qVar56;
  vec4 vVar57;
  vec3 p2;
  vec3 p2_00;
  vec4 color_00;
  vec4 color_01;
  vec4 color_02;
  vec3 axis [3];
  undefined8 uVar58;
  undefined8 uVar59;
  float s;
  float fStack_2e4;
  float local_2e0;
  undefined1 local_2d8 [8];
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined1 local_2c8 [8];
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined1 local_2b8 [16];
  int idx;
  undefined1 local_298 [8];
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined1 local_288 [8];
  undefined4 uStack_280;
  undefined4 uStack_27c;
  float local_270;
  uint local_26c;
  undefined1 local_268 [8];
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined1 local_258 [8];
  undefined4 uStack_250;
  undefined4 uStack_24c;
  float t;
  float fStack_244;
  float local_240;
  undefined1 local_238 [16];
  golf_gizmo_t *local_228;
  float local_220;
  float r_angle;
  vec3 c2;
  undefined8 uStack_1f0;
  vec3 closest_point [3];
  vec3 local_1b8;
  undefined8 local_1ac;
  float local_1a4;
  undefined8 local_1a0;
  float local_198;
  undefined1 local_188 [16];
  quat *local_170;
  vec4 color [3];
  vec3 c1;
  float fStack_12c;
  float local_128;
  float fStack_124;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  mat4 model_mat;
  
  if (gizmo->is_on == true) {
    pgVar40 = golf_inputs_get();
    pgVar41 = golf_graphics_get();
    pgVar1 = &gizmo->transform;
    uVar2 = (pgVar1->position).x;
    uVar17 = (pgVar1->position).y;
    local_2b8._4_4_ = uVar17;
    local_2b8._0_4_ = uVar2;
    fVar51 = (gizmo->transform).position.z;
    local_2b8._8_8_ = 0;
    fVar14 = vec3_distance(pgVar41->cam_pos,pgVar1->position);
    local_258._0_4_ = fVar14 * 0.1;
    mat4_from_quat(&model_mat,(gizmo->transform).rotation);
    vVar55 = vec3_create(1.0,0.0,0.0);
    m.m[2] = model_mat.m[2];
    m.m[3] = model_mat.m[3];
    m.m[0] = model_mat.m[0];
    m.m[1] = model_mat.m[1];
    m.m[4] = model_mat.m[4];
    m.m[5] = model_mat.m[5];
    m.m[6] = model_mat.m[6];
    m.m[7] = model_mat.m[7];
    m.m[8] = model_mat.m[8];
    m.m[9] = model_mat.m[9];
    m.m[10] = model_mat.m[10];
    m.m[0xb] = model_mat.m[0xb];
    m.m[0xc] = model_mat.m[0xc];
    m.m[0xd] = model_mat.m[0xd];
    m.m[0xe] = model_mat.m[0xe];
    m.m[0xf] = model_mat.m[0xf];
    vVar55 = vec3_apply_mat4(vVar55,0.0,m);
    local_1b8.z = vVar55.z;
    local_1b8._0_8_ = vVar55._0_8_;
    vVar55 = vec3_create(0.0,1.0,0.0);
    m_00.m[2] = model_mat.m[2];
    m_00.m[3] = model_mat.m[3];
    m_00.m[0] = model_mat.m[0];
    m_00.m[1] = model_mat.m[1];
    m_00.m[4] = model_mat.m[4];
    m_00.m[5] = model_mat.m[5];
    m_00.m[6] = model_mat.m[6];
    m_00.m[7] = model_mat.m[7];
    m_00.m[8] = model_mat.m[8];
    m_00.m[9] = model_mat.m[9];
    m_00.m[10] = model_mat.m[10];
    m_00.m[0xb] = model_mat.m[0xb];
    m_00.m[0xc] = model_mat.m[0xc];
    m_00.m[0xd] = model_mat.m[0xd];
    m_00.m[0xe] = model_mat.m[0xe];
    m_00.m[0xf] = model_mat.m[0xf];
    vVar55 = vec3_apply_mat4(vVar55,0.0,m_00);
    local_1a4 = vVar55.z;
    local_1ac = vVar55._0_8_;
    vVar55 = vec3_create(0.0,0.0,1.0);
    m_01.m[2] = model_mat.m[2];
    m_01.m[3] = model_mat.m[3];
    m_01.m[0] = model_mat.m[0];
    m_01.m[1] = model_mat.m[1];
    m_01.m[4] = model_mat.m[4];
    m_01.m[5] = model_mat.m[5];
    m_01.m[6] = model_mat.m[6];
    m_01.m[7] = model_mat.m[7];
    m_01.m[8] = model_mat.m[8];
    m_01.m[9] = model_mat.m[9];
    m_01.m[10] = model_mat.m[10];
    m_01.m[0xb] = model_mat.m[0xb];
    m_01.m[0xc] = model_mat.m[0xc];
    m_01.m[0xd] = model_mat.m[0xd];
    m_01.m[0xe] = model_mat.m[0xe];
    m_01.m[0xf] = model_mat.m[0xf];
    vVar55 = vec3_apply_mat4(vVar55,0.0,m_01);
    local_198 = vVar55.z;
    local_1a0 = vVar55._0_8_;
    color[0] = vec4_create(1.0,0.0,0.0,1.0);
    color[1] = vec4_create(0.0,1.0,0.0,1.0);
    color[2] = vec4_create(0.0,0.0,1.0,1.0);
    auVar36 = local_2b8;
    gVar32 = gizmo->operation;
    local_228 = gizmo;
    if (gVar32 == GOLF_GIZMO_SCALE) {
      uVar43 = 0xffffffff;
      fVar14 = 3.4028235e+38;
      uVar42 = 0;
      fVar20 = model_mat.m[8];
      fVar52 = model_mat.m[9];
      uVar58 = model_mat.m._0_8_;
      uVar59 = model_mat.m._8_8_;
      for (lVar49 = 0; pgVar35 = local_228, lVar49 != 0x24; lVar49 = lVar49 + 0xc) {
        pvVar47 = &pgVar40->mouse_ray_orig;
        uVar7 = pvVar47->x;
        uVar22 = pvVar47->y;
        local_2c8._4_4_ = uVar22;
        local_2c8._0_4_ = uVar7;
        _uStack_2c0 = 0;
        local_298._0_4_ = (pgVar40->mouse_ray_orig).z;
        local_2d8._0_4_ = fVar14;
        vVar55 = vec3_add(*pvVar47,pgVar40->mouse_ray_dir);
        uStack_280 = extraout_XMM0_Dc_09;
        local_288 = (undefined1  [8])vVar55._0_8_;
        uStack_27c = extraout_XMM0_Dd_09;
        local_268._0_4_ = vVar55.z;
        v_01.z = *(float *)((long)&local_1b8.z + lVar49);
        v_01._0_8_ = *(undefined8 *)((long)&local_1b8.x + lVar49);
        vVar55 = vec3_scale(v_01,(float)local_258._0_4_);
        auVar36 = local_2b8;
        v1_12.z = fVar51;
        v1_12.x = (float)local_2b8._0_4_;
        v1_12.y = (float)local_2b8._4_4_;
        local_2b8 = auVar36;
        vVar55 = vec3_add(v1_12,vVar55);
        auVar37 = _local_288;
        auVar36 = _local_2c8;
        p1_00.z = (float)local_298._0_4_;
        p1_00.x = (float)local_2c8._0_4_;
        p1_00.y = (float)local_2c8._4_4_;
        q1_00.z = (float)local_268._0_4_;
        q1_00.x = (float)local_288._0_4_;
        q1_00.y = (float)local_288._4_4_;
        p2_00.z = fVar51;
        p2_00.x = (float)(int)local_2b8._0_8_;
        p2_00.y = (float)(int)((ulong)local_2b8._0_8_ >> 0x20);
        fVar20 = local_2b8._0_4_;
        fVar52 = local_2b8._4_4_;
        _local_2c8 = auVar36;
        _local_288 = auVar37;
        closest_point_ray_ray(p1_00,q1_00,p2_00,vVar55,&s,&t,&c1,&c2);
        world_pos_02.z = c1.z;
        world_pos_02.x = c1.x;
        world_pos_02.y = c1.y;
        vVar34 = golf_graphics_world_to_screen(world_pos_02);
        uStack_2c0 = extraout_XMM0_Dc_10;
        local_2c8._0_4_ = vVar34.x;
        local_2c8._4_4_ = vVar34.y;
        uStack_2bc = extraout_XMM0_Dd_10;
        vVar55.z = c2.z;
        vVar55.x = c2.x;
        vVar55.y = c2.y;
        vVar34 = golf_graphics_world_to_screen(vVar55);
        fVar29 = vec2_distance((vec2)local_2c8,vVar34);
        fVar14 = fVar29;
        if ((t > 1.4 || 0.0 > t) || fVar29 >= (float)local_2d8._0_4_) {
          fVar14 = (float)local_2d8._0_4_;
        }
        if ((t <= 1.4 && 0.0 <= t) && fVar29 < (float)local_2d8._0_4_) {
          uVar43 = uVar42;
        }
        *(undefined8 *)((long)&closest_point[0].x + lVar49) = c2._0_8_;
        *(float *)((long)&closest_point[0].z + lVar49) = c2.z;
        uVar42 = uVar42 + 1;
      }
      uVar42 = 0xffffffff;
      if (fVar14 < 8.0) {
        uVar42 = uVar43;
      }
      uVar46 = CONCAT44(0,uVar42);
      local_268 = (undefined1  [8])uVar46;
      if (local_228->is_active == false) {
        if ((-1 < (int)uVar42) && (pgVar40->mouse_down[0] == true)) {
          local_228->is_active = true;
          (local_228->scale).axis = uVar42;
          fVar14 = closest_point[uVar46].y;
          (pgVar35->scale).start_point.x = closest_point[uVar46].x;
          (pgVar35->scale).start_point.y = fVar14;
          (local_228->scale).start_point.z = closest_point[uVar46].z;
          fVar14 = (local_228->transform).scale.y;
          (pgVar35->scale).start_scale.x = (local_228->transform).scale.x;
          (pgVar35->scale).start_scale.y = fVar14;
          (local_228->scale).start_scale.z = (local_228->transform).scale.z;
          vVar55 = vec3_create(0.0,0.0,0.0);
          uStack_2d0 = extraout_XMM0_Dc_20;
          local_2d8 = (undefined1  [8])vVar55._0_8_;
          uStack_2cc = extraout_XMM0_Dd_20;
          local_2c8._0_4_ = vVar55.z;
          vVar55 = vec3_create(0.0,0.0,0.0);
          uStack_290 = extraout_XMM0_Dc_21;
          local_298 = (undefined1  [8])vVar55._0_8_;
          uStack_28c = extraout_XMM0_Dd_21;
          local_288._0_4_ = vVar55.z;
          qVar56 = quat_create(0.0,0.0,0.0,1.0);
          auVar37 = _local_298;
          auVar36 = _local_2d8;
          fVar20 = qVar56.x;
          fVar52 = qVar56.y;
          position_00.z = (float)local_2c8._0_4_;
          position_00.x = (float)local_2d8._0_4_;
          position_00.y = (float)local_2d8._4_4_;
          scale_00.z = (float)local_288._0_4_;
          scale_00.x = (float)local_298._0_4_;
          scale_00.y = (float)local_298._4_4_;
          _local_2d8 = auVar36;
          _local_298 = auVar37;
          golf_transform((golf_transform_t *)&c1,position_00,scale_00,qVar56);
          (pgVar35->delta_transform).scale.y = local_118;
          (pgVar35->delta_transform).scale.z = fStack_114;
          (pgVar35->delta_transform).rotation.y = local_128;
          (pgVar35->delta_transform).rotation.z = fStack_124;
          *(undefined8 *)&(pgVar35->delta_transform).rotation.w = uStack_120;
          (pgVar35->delta_transform).position.x = c1.x;
          (pgVar35->delta_transform).position.y = c1.y;
          *(ulong *)&(pgVar35->delta_transform).position.z = CONCAT44(fStack_12c,c1.z);
        }
      }
      else {
        igCaptureMouseFromApp(true);
        if (pgVar40->mouse_down[0] == false) {
          pgVar35->is_active = false;
        }
        iVar44 = (pgVar35->scale).axis;
        uVar8 = closest_point[iVar44].x;
        uVar23 = closest_point[iVar44].y;
        v1_13.y = (float)uVar23;
        v1_13.x = (float)uVar8;
        v1_13.z = closest_point[iVar44].z;
        vVar55 = vec3_sub(v1_13,(pgVar35->scale).start_point);
        vVar55 = vec3_snap(vVar55,(pgVar35->scale).snap);
        uStack_2d0 = extraout_XMM0_Dc_11;
        local_2d8 = (undefined1  [8])vVar55._0_8_;
        uStack_2cc = extraout_XMM0_Dd_11;
        local_2c8._0_4_ = vVar55.z;
        vVar55 = vec3_add((pgVar35->scale).start_scale,vVar55);
        auVar36 = _local_2d8;
        (pgVar35->transform).scale.x = (float)(int)vVar55._0_8_;
        (pgVar35->transform).scale.y = (float)(int)((ulong)vVar55._0_8_ >> 0x20);
        (pgVar35->transform).scale.z = vVar55.z;
        (pgVar35->delta_transform).scale.x = (float)local_2d8._0_4_;
        (pgVar35->delta_transform).scale.y = (float)local_2d8._4_4_;
        (pgVar35->delta_transform).scale.z = (float)local_2c8._0_4_;
        _local_2d8 = auVar36;
      }
      pfVar50 = &color[0].z;
      pfVar48 = &local_1b8.z;
      for (uVar46 = 0; auVar36 = local_2b8, uVar46 != 3; uVar46 = uVar46 + 1) {
        world_pos_05.z = fVar51;
        world_pos_05.x = (float)local_2b8._0_4_;
        world_pos_05.y = (float)local_2b8._4_4_;
        local_2b8 = auVar36;
        vVar34 = golf_graphics_world_to_screen(world_pos_05);
        uStack_2c0 = extraout_XMM0_Dc_22;
        local_2c8._0_4_ = vVar34.x;
        local_2c8._4_4_ = vVar34.y;
        uStack_2bc = extraout_XMM0_Dd_22;
        uVar13 = ((vec3 *)(pfVar48 + -2))->x;
        uVar28 = ((vec3 *)(pfVar48 + -2))->y;
        v_03.y = (float)uVar28;
        v_03.x = (float)uVar13;
        v_03.z = *pfVar48;
        vVar55 = vec3_scale(v_03,(float)local_258._0_4_);
        auVar36 = local_2b8;
        v1_16.z = fVar51;
        v1_16.x = (float)local_2b8._0_4_;
        v1_16.y = (float)local_2b8._4_4_;
        local_2b8 = auVar36;
        vVar55 = vec3_add(v1_16,vVar55);
        vVar34 = golf_graphics_world_to_screen(vVar55);
        uStack_2d0 = extraout_XMM0_Dc_23;
        local_2d8._0_4_ = vVar34.x;
        local_2d8._4_4_ = vVar34.y;
        uStack_2cc = extraout_XMM0_Dd_23;
        fVar14 = ((vec4 *)(pfVar50 + -2))->x;
        fVar29 = ((vec4 *)(pfVar50 + -2))->y;
        uVar4 = 0;
        uVar19 = 0;
        fVar16 = (float)*(undefined8 *)pfVar50;
        fVar31 = (float)((ulong)*(undefined8 *)pfVar50 >> 0x20);
        uVar53 = 0;
        uVar54 = 0;
        if (((pgVar35->is_active == false) && (local_268 == (undefined1  [8])uVar46)) ||
           ((pgVar35->is_active != false && (uVar46 == (uint)(pgVar35->scale).axis)))) {
          uVar53 = 0;
          uVar54 = 0;
          vVar57 = vec4_create(1.0,1.0,0.0,1.0);
          fVar16 = vVar57.z;
          fVar31 = vVar57.w;
          fVar14 = vVar57.x;
          fVar29 = vVar57.y;
          uVar4 = extraout_XMM0_Dc_24;
          uVar19 = extraout_XMM0_Dd_24;
        }
        local_298._4_4_ = fVar29;
        local_298._0_4_ = fVar14;
        uStack_290 = uVar4;
        uStack_28c = uVar19;
        local_288._4_4_ = fVar31;
        local_288._0_4_ = fVar16;
        uStack_280 = uVar53;
        uStack_27c = uVar54;
        vVar57.y = fVar31;
        vVar57.x = fVar16;
        vVar57.w = fVar52;
        vVar57.z = fVar20;
        _add_line(draw_list,(vec2)local_2c8,(vec2)local_2d8,fVar14,vVar57);
        col_00.z = (float)uVar59;
        col_00.w = SUB84(uVar59,4);
        col_00.x = (float)uVar58;
        col_00.y = SUB84(uVar58,4);
        IVar39 = igGetColorU32_Vec4(col_00);
        ImDrawList_AddCircleFilled(draw_list,(ImVec2)local_2d8,7.5,IVar39,100);
        pfVar50 = pfVar50 + 4;
        pfVar48 = pfVar48 + 3;
      }
    }
    else if (gVar32 == GOLF_GIZMO_ROTATE) {
      local_170 = &(gizmo->transform).rotation;
      uVar4 = (pgVar40->mouse_ray_orig).x;
      uVar19 = (pgVar40->mouse_ray_orig).y;
      local_2d8._4_4_ = uVar19;
      local_2d8._0_4_ = uVar4;
      fVar14 = (pgVar40->mouse_ray_orig).z;
      uVar5 = (pgVar40->mouse_ray_dir).x;
      fVar20 = (pgVar40->mouse_ray_dir).y;
      local_298._4_4_ = fVar20;
      local_298._0_4_ = uVar5;
      uVar53 = 0;
      uVar54 = 0;
      s = (float)local_2b8._0_4_;
      fStack_2e4 = (float)local_2b8._4_4_;
      local_26c = 0xffffffff;
      local_270 = 3.4028235e+38;
      uVar43 = 0;
      pvVar47 = &local_1b8;
      _uStack_2d0 = 0;
      local_2c8._0_4_ = fVar14;
      _uStack_290 = 0;
      local_288._0_4_ = (pgVar40->mouse_ray_dir).z;
      uVar58 = model_mat.m._0_8_;
      uVar59 = model_mat.m._8_8_;
      local_2e0 = fVar51;
      local_2b8 = auVar36;
      for (lVar49 = 8; lVar49 != 0x2c; lVar49 = lVar49 + 0xc) {
        plane_point.z = local_2e0;
        plane_point.x = s;
        plane_point.y = fStack_2e4;
        point.y = (float)uVar19;
        point.x = (float)uVar4;
        point.z = fVar14;
        vVar55 = closest_point_point_plane(point,plane_point,*pvVar47);
        v2.z = local_2e0;
        v2.x = s;
        v2.y = fStack_2e4;
        vVar55 = vec3_sub(vVar55,v2);
        vVar55 = vec3_set_length(vVar55,(float)local_258._0_4_);
        v1.z = local_2e0;
        v1.x = s;
        v1.y = fStack_2e4;
        vVar55 = vec3_add(v1,vVar55);
        auVar36 = _local_2d8;
        v1_09.z = vVar55.z;
        local_2b8._8_4_ = extraout_XMM0_Dc_01;
        local_2b8._0_8_ = vVar55._0_8_;
        local_2b8._12_4_ = extraout_XMM0_Dd_01;
        *(long *)((long)&uStack_1f0 + lVar49) = vVar55._0_8_;
        *(float *)((long)&closest_point[0].x + lVar49) = v1_09.z;
        uVar53 = local_298._8_4_;
        uVar54 = local_298._12_4_;
        ro.z = (float)local_2c8._0_4_;
        ro.x = (float)local_2d8._0_4_;
        ro.y = (float)local_2d8._4_4_;
        rd.z = (float)local_288._0_4_;
        rd.x = (float)(int)local_298;
        rd.y = (float)(int)((ulong)local_298 >> 0x20);
        fVar20 = local_298._4_4_;
        _local_2d8 = auVar36;
        _Var38 = ray_intersect_planes(ro,rd,(vec3 *)&s,pvVar47,1,&t,&idx);
        auVar36 = _local_298;
        if (_Var38) {
          v_00.z = (float)local_288._0_4_;
          v_00.x = (float)local_298._0_4_;
          v_00.y = (float)local_298._4_4_;
          _local_298 = auVar36;
          vVar55 = vec3_scale(v_00,t);
          auVar36 = _local_2d8;
          v1_08.z = (float)local_2c8._0_4_;
          v1_08.x = (float)local_2d8._0_4_;
          v1_08.y = (float)local_2d8._4_4_;
          _local_2d8 = auVar36;
          vVar55 = vec3_add(v1_08,vVar55);
          local_220 = vVar55.z;
          v2_00.z = local_2e0;
          v2_00.x = s;
          v2_00.y = fStack_2e4;
          local_188._8_4_ = extraout_XMM0_Dc_02;
          local_188._0_8_ = vVar55._0_8_;
          local_188._12_4_ = extraout_XMM0_Dd_02;
          vVar55 = vec3_sub(vVar55,v2_00);
          vVar55 = vec3_set_length(vVar55,(float)local_258._0_4_);
          v1_00.z = local_2e0;
          v1_00.x = s;
          v1_00.y = fStack_2e4;
          vVar55 = vec3_add(v1_00,vVar55);
          auVar36 = local_2b8;
          uStack_260 = extraout_XMM0_Dc_03;
          local_268 = (undefined1  [8])vVar55._0_8_;
          uStack_25c = extraout_XMM0_Dd_03;
          local_238._0_4_ = vVar55.z;
          *(long *)((long)&local_220 + lVar49) = vVar55._0_8_;
          *(float *)((long)&c2.x + lVar49) = vVar55.z;
          v2_01.z = local_2e0;
          v2_01.x = s;
          v2_01.y = fStack_2e4;
          v1_09.x = (float)local_2b8._0_4_;
          v1_09.y = (float)local_2b8._4_4_;
          local_2b8 = auVar36;
          vVar55 = vec3_sub(v1_09,v2_01);
          auVar36 = _local_268;
          u.z = vVar55.z;
          local_2b8._8_4_ = extraout_XMM0_Dc_04;
          local_2b8._0_8_ = vVar55._0_8_;
          local_2b8._12_4_ = extraout_XMM0_Dd_04;
          v2_02.z = local_2e0;
          v2_02.x = s;
          v2_02.y = fStack_2e4;
          v1_10.z = (float)local_238._0_4_;
          v1_10.x = (float)local_268._0_4_;
          v1_10.y = (float)local_268._4_4_;
          _local_268 = auVar36;
          vVar55 = vec3_sub(v1_10,v2_02);
          auVar36 = local_2b8;
          fVar20 = vVar55.y;
          u.x = (float)local_2b8._0_4_;
          u.y = (float)local_2b8._4_4_;
          uVar53 = extraout_XMM0_Dc_05;
          uVar54 = extraout_XMM0_Dd_05;
          local_2b8 = auVar36;
          qVar56 = quat_between_vectors(u,vVar55);
          quat_get_axis_angle(qVar56,&c1,&r_angle);
          auVar36 = local_188;
          if (ABS(r_angle) <= 1.5707964) {
            world_pos_03.z = local_220;
            world_pos_03.x = (float)local_188._0_4_;
            world_pos_03.y = (float)local_188._4_4_;
            local_188 = auVar36;
            vVar34 = golf_graphics_world_to_screen(world_pos_03);
            auVar36 = _local_268;
            local_2b8._8_4_ = extraout_XMM0_Dc_06;
            local_2b8._0_4_ = vVar34.x;
            local_2b8._4_4_ = vVar34.y;
            local_2b8._12_4_ = extraout_XMM0_Dd_06;
            world_pos_04.z = (float)local_238._0_4_;
            world_pos_04.x = (float)local_268._0_4_;
            world_pos_04.y = (float)local_268._4_4_;
            _local_268 = auVar36;
            vVar34 = golf_graphics_world_to_screen(world_pos_04);
            fVar51 = vec2_distance((vec2)local_2b8._0_8_,vVar34);
            if (fVar51 < local_270) {
              local_270 = fVar51;
              local_26c = uVar43;
            }
          }
        }
        uVar43 = uVar43 + 1;
        pvVar47 = pvVar47 + 1;
        fVar14 = (float)local_2c8._0_4_;
        uVar4 = local_2d8._0_4_;
        uVar19 = local_2d8._4_4_;
      }
      uVar43 = 0xffffffff;
      if (local_270 < 8.0) {
        uVar43 = local_26c;
      }
      uVar46 = (ulong)uVar43;
      if (gizmo->is_active == false) {
        if ((-1 < (int)uVar43) && (pgVar40->mouse_down[0] == true)) {
          gizmo->is_active = true;
          (gizmo->rotate).axis = uVar43;
          (gizmo->rotate).axis_rotation.z = (&local_1b8)[uVar46].z;
          fVar51 = (&local_1b8)[uVar46].y;
          (gizmo->rotate).axis_rotation.x = (&local_1b8)[uVar46].x;
          (gizmo->rotate).axis_rotation.y = fVar51;
          fVar51 = (&c2)[uVar46].y;
          (gizmo->rotate).start_point.x = (&c2)[uVar46].x;
          (gizmo->rotate).start_point.y = fVar51;
          (gizmo->rotate).start_point.z = (&c2)[uVar46].z;
          fVar51 = local_170->y;
          fVar14 = local_170->z;
          fVar20 = local_170->w;
          (gizmo->rotate).start_rotation.x = local_170->x;
          (gizmo->rotate).start_rotation.y = fVar51;
          (gizmo->rotate).start_rotation.z = fVar14;
          (gizmo->rotate).start_rotation.w = fVar20;
          vVar55 = vec3_create(0.0,0.0,0.0);
          position.z = vVar55.z;
          local_2b8._8_4_ = extraout_XMM0_Dc_14;
          local_2b8._0_8_ = vVar55._0_8_;
          local_2b8._12_4_ = extraout_XMM0_Dd_14;
          vVar55 = vec3_create(0.0,0.0,0.0);
          uStack_250 = extraout_XMM0_Dc_15;
          local_258 = (undefined1  [8])vVar55._0_8_;
          uStack_24c = extraout_XMM0_Dd_15;
          local_2d8._0_4_ = vVar55.z;
          qVar56 = quat_create(0.0,0.0,0.0,1.0);
          auVar36 = local_2b8;
          uVar53 = local_258._8_4_;
          uVar54 = local_258._12_4_;
          position.x = (float)local_2b8._0_4_;
          position.y = (float)local_2b8._4_4_;
          scale.z = (float)local_2d8._0_4_;
          scale.x = (float)(int)local_258;
          scale.y = (float)(int)((ulong)local_258 >> 0x20);
          fVar20 = local_258._4_4_;
          local_2b8 = auVar36;
          golf_transform((golf_transform_t *)&c1,position,scale,qVar56);
          (gizmo->delta_transform).scale.y = local_118;
          (gizmo->delta_transform).scale.z = fStack_114;
          (gizmo->delta_transform).rotation.y = local_128;
          (gizmo->delta_transform).rotation.z = fStack_124;
          *(undefined8 *)&(gizmo->delta_transform).rotation.w = uStack_120;
          (gizmo->delta_transform).position.x = c1.x;
          (gizmo->delta_transform).position.y = c1.y;
          *(ulong *)&(gizmo->delta_transform).position.z = CONCAT44(fStack_12c,c1.z);
        }
      }
      else {
        igCaptureMouseFromApp(true);
        if (pgVar40->mouse_down[0] == false) {
          gizmo->is_active = false;
        }
        iVar44 = (gizmo->rotate).axis;
        v2_03.z = local_2e0;
        v2_03.x = s;
        v2_03.y = fStack_2e4;
        vVar55 = vec3_sub((gizmo->rotate).start_point,v2_03);
        vVar55 = vec3_normalize(vVar55);
        u_00.z = vVar55.z;
        local_2b8._8_4_ = extraout_XMM0_Dc_07;
        local_2b8._0_8_ = vVar55._0_8_;
        local_2b8._12_4_ = extraout_XMM0_Dd_07;
        uVar6 = (&c2)[iVar44].x;
        uVar21 = (&c2)[iVar44].y;
        v1_11.y = (float)uVar21;
        v1_11.x = (float)uVar6;
        v2_04.z = local_2e0;
        v2_04.x = s;
        v2_04.y = fStack_2e4;
        v1_11.z = (&c2)[iVar44].z;
        vVar55 = vec3_sub(v1_11,v2_04);
        vVar55 = vec3_normalize(vVar55);
        auVar36 = local_2b8;
        u_00.x = (float)local_2b8._0_4_;
        u_00.y = (float)local_2b8._4_4_;
        local_2b8 = auVar36;
        qVar56 = quat_between_vectors(u_00,vVar55);
        quat_get_axis_angle(qVar56,(vec3 *)&t,(float *)&idx);
        if (((float)idx != 0.0) || (NAN((float)idx))) {
          v1_06.y = fStack_244;
          v1_06.z = local_240;
          v1_06.x = t;
          fVar51 = vec3_dot(v1_06,(gizmo->rotate).axis_rotation);
          if (fVar51 < 0.0) {
            idx = idx ^ 0x80000000;
          }
          idx = (int)golf_snapf((float)idx,(gizmo->rotate).snap * 0.017453292);
          uVar4 = 0;
          uVar19 = 0;
          qVar56 = quat_create_from_axis_angle((gizmo->rotate).axis_rotation,(float)idx);
          uStack_2d0 = extraout_XMM0_Dc_08;
          local_2d8 = (undefined1  [8])qVar56._0_8_;
          uStack_2cc = extraout_XMM0_Dd_08;
          uStack_2c0 = uVar4;
          local_2c8 = (undefined1  [8])qVar56._8_8_;
          uStack_2bc = uVar19;
          qVar56 = quat_multiply(qVar56,(gizmo->rotate).start_rotation);
          (gizmo->transform).rotation = qVar56;
          (gizmo->delta_transform).rotation.x = (float)local_2d8._0_4_;
          (gizmo->delta_transform).rotation.y = (float)local_2d8._4_4_;
          (gizmo->delta_transform).rotation.z = local_2c8._0_4_;
          (gizmo->delta_transform).rotation.w = local_2c8._4_4_;
        }
        world_pos.z = local_2e0;
        world_pos.x = s;
        world_pos.y = fStack_2e4;
        c1._0_8_ = golf_graphics_world_to_screen(world_pos);
        for (lVar49 = 0; auVar36 = local_2b8, lVar49 != 0x18; lVar49 = lVar49 + 1) {
          vec.z = u_00.z;
          vec.x = (float)local_2b8._0_4_;
          vec.y = (float)local_2b8._4_4_;
          local_2b8 = auVar36;
          vVar55 = vec3_rotate_about_axis
                             (vec,(local_228->rotate).axis_rotation,
                              ((float)(int)lVar49 / 23.0) * (float)idx);
          vVar55 = vec3_scale(vVar55,(float)local_258._0_4_);
          v1_01.z = local_2e0;
          v1_01.x = s;
          v1_01.y = fStack_2e4;
          vVar55 = vec3_add(v1_01,vVar55);
          vVar34 = golf_graphics_world_to_screen(vVar55);
          *(vec2 *)(&c1.z + lVar49 * 2) = vVar34;
        }
        fVar20 = 0.0;
        uVar53 = 0;
        uVar54 = 0;
        vec4_create(1.0,1.0,1.0,0.4);
        col.z = (float)uVar59;
        col.w = SUB84(uVar59,4);
        col.x = (float)uVar58;
        col.y = SUB84(uVar58,4);
        IVar39 = igGetColorU32_Vec4(col);
        ImDrawList_AddConvexPolyFilled(draw_list,(ImVec2 *)&c1,0x19,IVar39);
        gizmo = local_228;
      }
      for (uVar45 = 0; uVar45 != 3; uVar45 = uVar45 + 1) {
        uVar10 = color[uVar45].x;
        uVar25 = color[uVar45].y;
        local_2c8._4_4_ = uVar25;
        local_2c8._0_4_ = uVar10;
        _uStack_2c0 = 0;
        uVar11 = color[uVar45].z;
        uVar26 = color[uVar45].w;
        local_298._4_4_ = uVar26;
        local_298._0_4_ = uVar11;
        _uStack_290 = 0;
        if (((gizmo->is_active == false) && (uVar45 == uVar46)) ||
           ((gizmo->is_active != false && (uVar45 == (uint)(gizmo->rotate).axis)))) {
          fVar20 = 0.0;
          uVar53 = 0;
          uVar54 = 0;
          uVar4 = 0;
          uVar19 = 0;
          vVar57 = vec4_create(1.0,1.0,0.0,1.0);
          uStack_2c0 = extraout_XMM0_Dc_16;
          local_2c8 = (undefined1  [8])vVar57._0_8_;
          uStack_2bc = extraout_XMM0_Dd_16;
          uStack_290 = uVar4;
          local_298 = (undefined1  [8])vVar57._8_8_;
          uStack_28c = uVar19;
        }
        uVar12 = closest_point[uVar45].x;
        uVar27 = closest_point[uVar45].y;
        local_268._4_4_ = uVar27;
        local_268._0_4_ = uVar12;
        _uStack_260 = 0;
        local_238._0_4_ = closest_point[uVar45].z;
        pvVar47 = &local_1b8 + uVar45;
        for (iVar44 = 1; auVar36 = _local_268, iVar44 != 0x15; iVar44 = iVar44 + 1) {
          local_2d8._4_4_ = fVar20;
          local_2d8._0_4_ = ((float)(iVar44 + -1) / 20.0) * 1.5707964;
          uStack_2d0 = uVar53;
          uStack_2cc = uVar54;
          local_258._4_4_ = fVar20;
          local_258._0_4_ = ((float)iVar44 / 20.0) * 1.5707964;
          uStack_250 = uVar53;
          uStack_24c = uVar54;
          v2_05.z = local_2e0;
          v2_05.x = s;
          v2_05.y = fStack_2e4;
          v1_15.z = (float)local_238._0_4_;
          v1_15.x = (float)local_268._0_4_;
          v1_15.y = (float)local_268._4_4_;
          _local_268 = auVar36;
          vVar55 = vec3_sub(v1_15,v2_05);
          vec_00.z = vVar55.z;
          local_2b8._8_4_ = extraout_XMM0_Dc_17;
          local_2b8._0_8_ = vVar55._0_8_;
          local_2b8._12_4_ = extraout_XMM0_Dd_17;
          vVar55 = vec3_rotate_about_axis(vVar55,*pvVar47,(float)local_2d8._0_4_);
          v1_02.z = local_2e0;
          v1_02.x = s;
          v1_02.y = fStack_2e4;
          vVar55 = vec3_add(v1_02,vVar55);
          vVar34 = golf_graphics_world_to_screen(vVar55);
          auVar36 = local_2b8;
          uStack_280 = extraout_XMM0_Dc_18;
          local_288._0_4_ = vVar34.x;
          local_288._4_4_ = vVar34.y;
          uStack_27c = extraout_XMM0_Dd_18;
          vec_00.x = (float)local_2b8._0_4_;
          vec_00.y = (float)local_2b8._4_4_;
          fVar51 = (float)local_258._0_4_;
          uVar4 = local_258._4_4_;
          local_2b8 = auVar36;
          vVar55 = vec3_rotate_about_axis(vec_00,*pvVar47,(float)local_258._0_4_);
          v1_03.z = local_2e0;
          v1_03.x = s;
          v1_03.y = fStack_2e4;
          vVar55 = vec3_add(v1_03,vVar55);
          vVar34 = golf_graphics_world_to_screen(vVar55);
          auVar36 = _local_298;
          color_00.w = (float)uVar4;
          color_00.z = fVar51;
          color_00.x = (float)local_298._0_4_;
          color_00.y = (float)local_298._4_4_;
          _local_298 = auVar36;
          _add_line(draw_list,(vec2)local_288,vVar34,(float)local_2c8._0_4_,color_00);
          auVar36 = local_2b8;
          vec_01.z = vec_00.z;
          vec_01.x = (float)local_2b8._0_4_;
          vec_01.y = (float)local_2b8._4_4_;
          local_2b8 = auVar36;
          vVar55 = vec3_rotate_about_axis(vec_01,*pvVar47,-(float)local_2d8._0_4_);
          v1_04.z = local_2e0;
          v1_04.x = s;
          v1_04.y = fStack_2e4;
          vVar55 = vec3_add(v1_04,vVar55);
          vVar34 = golf_graphics_world_to_screen(vVar55);
          auVar36 = local_2b8;
          uStack_2d0 = extraout_XMM0_Dc_19;
          local_2d8._0_4_ = vVar34.x;
          local_2d8._4_4_ = vVar34.y;
          uStack_2cc = extraout_XMM0_Dd_19;
          fVar51 = -(float)local_258._0_4_;
          uVar43 = local_258._4_4_ ^ 0x80000000;
          vec_02.z = vec_00.z;
          vec_02.x = (float)local_2b8._0_4_;
          vec_02.y = (float)local_2b8._4_4_;
          local_2b8 = auVar36;
          vVar55 = vec3_rotate_about_axis(vec_02,*pvVar47,fVar51);
          v1_05.z = local_2e0;
          v1_05.x = s;
          v1_05.y = fStack_2e4;
          vVar55 = vec3_add(v1_05,vVar55);
          vVar34 = golf_graphics_world_to_screen(vVar55);
          auVar36 = _local_298;
          color_01.w = (float)uVar43;
          color_01.z = fVar51;
          color_01.x = (float)local_298._0_4_;
          color_01.y = (float)local_298._4_4_;
          fVar20 = (float)local_2c8._4_4_;
          uVar53 = uStack_2c0;
          uVar54 = uStack_2bc;
          _local_298 = auVar36;
          _add_line(draw_list,(vec2)local_2d8,vVar34,(float)local_2c8._0_4_,color_01);
        }
      }
    }
    else if (gVar32 == GOLF_GIZMO_TRANSLATE) {
      local_238._0_8_ = &gizmo->transform;
      uVar43 = 0xffffffff;
      fVar14 = 3.4028235e+38;
      uVar42 = 0;
      fVar20 = model_mat.m[8];
      fVar52 = model_mat.m[9];
      uVar58 = model_mat.m._0_8_;
      uVar59 = model_mat.m._8_8_;
      for (lVar49 = 0; pgVar35 = local_228, lVar49 != 0x24; lVar49 = lVar49 + 0xc) {
        pvVar47 = &pgVar40->mouse_ray_orig;
        uVar3 = pvVar47->x;
        uVar18 = pvVar47->y;
        local_2c8._4_4_ = uVar18;
        local_2c8._0_4_ = uVar3;
        _uStack_2c0 = 0;
        local_298._0_4_ = (pgVar40->mouse_ray_orig).z;
        local_2d8._0_4_ = fVar14;
        vVar55 = vec3_add(*pvVar47,pgVar40->mouse_ray_dir);
        uStack_280 = extraout_XMM0_Dc;
        local_288 = (undefined1  [8])vVar55._0_8_;
        uStack_27c = extraout_XMM0_Dd;
        local_268._0_4_ = vVar55.z;
        v.z = *(float *)((long)&local_1b8.z + lVar49);
        v._0_8_ = *(undefined8 *)((long)&local_1b8.x + lVar49);
        vVar55 = vec3_scale(v,(float)local_258._0_4_);
        auVar36 = local_2b8;
        v1_07.z = fVar51;
        v1_07.x = (float)local_2b8._0_4_;
        v1_07.y = (float)local_2b8._4_4_;
        local_2b8 = auVar36;
        vVar55 = vec3_add(v1_07,vVar55);
        auVar37 = _local_288;
        auVar36 = _local_2c8;
        p1.z = (float)local_298._0_4_;
        p1.x = (float)local_2c8._0_4_;
        p1.y = (float)local_2c8._4_4_;
        q1.z = (float)local_268._0_4_;
        q1.x = (float)local_288._0_4_;
        q1.y = (float)local_288._4_4_;
        p2.z = fVar51;
        p2.x = (float)(int)local_2b8._0_8_;
        p2.y = (float)(int)((ulong)local_2b8._0_8_ >> 0x20);
        fVar20 = local_2b8._0_4_;
        fVar52 = local_2b8._4_4_;
        _local_2c8 = auVar36;
        _local_288 = auVar37;
        closest_point_ray_ray(p1,q1,p2,vVar55,&s,&t,&c1,&c2);
        world_pos_01.z = c1.z;
        world_pos_01.x = c1.x;
        world_pos_01.y = c1.y;
        vVar34 = golf_graphics_world_to_screen(world_pos_01);
        uStack_2c0 = extraout_XMM0_Dc_00;
        local_2c8._0_4_ = vVar34.x;
        local_2c8._4_4_ = vVar34.y;
        uStack_2bc = extraout_XMM0_Dd_00;
        world_pos_00.z = c2.z;
        world_pos_00.x = c2.x;
        world_pos_00.y = c2.y;
        vVar34 = golf_graphics_world_to_screen(world_pos_00);
        fVar29 = vec2_distance((vec2)local_2c8,vVar34);
        fVar14 = fVar29;
        if ((t > 1.4 || 0.0 > t) || fVar29 >= (float)local_2d8._0_4_) {
          fVar14 = (float)local_2d8._0_4_;
        }
        if ((t <= 1.4 && 0.0 <= t) && fVar29 < (float)local_2d8._0_4_) {
          uVar43 = uVar42;
        }
        *(undefined8 *)((long)&closest_point[0].x + lVar49) = c2._0_8_;
        *(float *)((long)&closest_point[0].z + lVar49) = c2.z;
        uVar42 = uVar42 + 1;
      }
      uVar42 = 0xffffffff;
      if (fVar14 < 8.0) {
        uVar42 = uVar43;
      }
      uVar46 = (ulong)uVar42;
      if (local_228->is_active == false) {
        if ((-1 < (int)uVar42) && (pgVar40->mouse_down[0] == true)) {
          local_228->is_active = true;
          (local_228->translate).axis = uVar42;
          fVar14 = closest_point[uVar46].y;
          (pgVar35->translate).start_point.x = closest_point[uVar46].x;
          (pgVar35->translate).start_point.y = fVar14;
          (local_228->translate).start_point.z = closest_point[uVar46].z;
          uVar33 = *(undefined8 *)local_238._0_8_;
          (pgVar35->translate).start_position.x = (float)(int)uVar33;
          (pgVar35->translate).start_position.y = (float)(int)((ulong)uVar33 >> 0x20);
          (local_228->translate).start_position.z = *(float *)(local_238._0_8_ + 8);
          vVar55 = vec3_create(0.0,0.0,0.0);
          uStack_2d0 = extraout_XMM0_Dc_25;
          local_2d8 = (undefined1  [8])vVar55._0_8_;
          uStack_2cc = extraout_XMM0_Dd_25;
          local_2c8._0_4_ = vVar55.z;
          vVar55 = vec3_create(0.0,0.0,0.0);
          uStack_290 = extraout_XMM0_Dc_26;
          local_298 = (undefined1  [8])vVar55._0_8_;
          uStack_28c = extraout_XMM0_Dd_26;
          local_288._0_4_ = vVar55.z;
          qVar56 = quat_create(0.0,0.0,0.0,1.0);
          auVar37 = _local_298;
          auVar36 = _local_2d8;
          fVar20 = qVar56.x;
          fVar52 = qVar56.y;
          position_01.z = (float)local_2c8._0_4_;
          position_01.x = (float)local_2d8._0_4_;
          position_01.y = (float)local_2d8._4_4_;
          scale_01.z = (float)local_288._0_4_;
          scale_01.x = (float)local_298._0_4_;
          scale_01.y = (float)local_298._4_4_;
          _local_2d8 = auVar36;
          _local_298 = auVar37;
          golf_transform((golf_transform_t *)&c1,position_01,scale_01,qVar56);
          (pgVar35->delta_transform).scale.y = local_118;
          (pgVar35->delta_transform).scale.z = fStack_114;
          (pgVar35->delta_transform).rotation.y = local_128;
          (pgVar35->delta_transform).rotation.z = fStack_124;
          *(undefined8 *)&(pgVar35->delta_transform).rotation.w = uStack_120;
          (pgVar35->delta_transform).position.x = c1.x;
          (pgVar35->delta_transform).position.y = c1.y;
          *(ulong *)&(pgVar35->delta_transform).position.z = CONCAT44(fStack_12c,c1.z);
        }
      }
      else {
        igCaptureMouseFromApp(true);
        if (pgVar40->mouse_down[0] == false) {
          pgVar35->is_active = false;
        }
        iVar44 = (pgVar35->translate).axis;
        uVar9 = closest_point[iVar44].x;
        uVar24 = closest_point[iVar44].y;
        v1_14.y = (float)uVar24;
        v1_14.x = (float)uVar9;
        v1_14.z = closest_point[iVar44].z;
        vVar55 = vec3_sub(v1_14,(pgVar35->translate).start_point);
        uStack_2d0 = extraout_XMM0_Dc_12;
        local_2d8 = (undefined1  [8])vVar55._0_8_;
        uStack_2cc = extraout_XMM0_Dd_12;
        local_2c8._0_4_ = vVar55.z;
        fVar14 = vec3_length(vVar55);
        fVar14 = golf_snapf(fVar14,(pgVar35->translate).snap);
        auVar36 = _local_2d8;
        v_02.z = (float)local_2c8._0_4_;
        v_02.x = (float)local_2d8._0_4_;
        v_02.y = (float)local_2d8._4_4_;
        _local_2d8 = auVar36;
        vVar55 = vec3_set_length(v_02,fVar14);
        uStack_2d0 = extraout_XMM0_Dc_13;
        local_2d8 = (undefined1  [8])vVar55._0_8_;
        uStack_2cc = extraout_XMM0_Dd_13;
        local_2c8._0_4_ = vVar55.z;
        vVar55 = vec3_add((pgVar35->translate).start_position,vVar55);
        auVar36 = _local_2d8;
        (pgVar35->transform).position.x = (float)(int)vVar55._0_8_;
        (pgVar35->transform).position.y = (float)(int)((ulong)vVar55._0_8_ >> 0x20);
        (pgVar35->transform).position.z = vVar55.z;
        (pgVar35->delta_transform).position.x = (float)local_2d8._0_4_;
        (pgVar35->delta_transform).position.y = (float)local_2d8._4_4_;
        (pgVar35->delta_transform).position.z = (float)local_2c8._0_4_;
        _local_2d8 = auVar36;
      }
      pfVar50 = &color[0].z;
      pfVar48 = &local_1b8.z;
      for (uVar45 = 0; auVar36 = local_2b8, uVar45 != 3; uVar45 = uVar45 + 1) {
        world_pos_06.z = fVar51;
        world_pos_06.x = (float)local_2b8._0_4_;
        world_pos_06.y = (float)local_2b8._4_4_;
        local_2b8 = auVar36;
        vVar34 = golf_graphics_world_to_screen(world_pos_06);
        uStack_2c0 = extraout_XMM0_Dc_27;
        local_2c8._0_4_ = vVar34.x;
        local_2c8._4_4_ = vVar34.y;
        uStack_2bc = extraout_XMM0_Dd_27;
        uVar15 = ((vec3 *)(pfVar48 + -2))->x;
        uVar30 = ((vec3 *)(pfVar48 + -2))->y;
        v_04.y = (float)uVar30;
        v_04.x = (float)uVar15;
        v_04.z = *pfVar48;
        vVar55 = vec3_scale(v_04,(float)local_258._0_4_);
        auVar36 = local_2b8;
        v1_17.z = fVar51;
        v1_17.x = (float)local_2b8._0_4_;
        v1_17.y = (float)local_2b8._4_4_;
        local_2b8 = auVar36;
        vVar55 = vec3_add(v1_17,vVar55);
        vVar34 = golf_graphics_world_to_screen(vVar55);
        uStack_2d0 = extraout_XMM0_Dc_28;
        local_2d8._0_4_ = vVar34.x;
        local_2d8._4_4_ = vVar34.y;
        uStack_2cc = extraout_XMM0_Dd_28;
        fVar16 = ((vec4 *)(pfVar50 + -2))->x;
        fVar31 = ((vec4 *)(pfVar50 + -2))->y;
        uVar4 = 0;
        uVar19 = 0;
        fVar14 = (float)*(undefined8 *)pfVar50;
        fVar29 = (float)((ulong)*(undefined8 *)pfVar50 >> 0x20);
        uVar53 = 0;
        uVar54 = 0;
        if (((pgVar35->is_active == false) && (uVar46 == uVar45)) ||
           ((pgVar35->is_active != false && (uVar45 == (uint)(pgVar35->translate).axis)))) {
          uVar53 = 0;
          uVar54 = 0;
          vVar57 = vec4_create(1.0,1.0,0.0,1.0);
          fVar14 = vVar57.z;
          fVar29 = vVar57.w;
          fVar16 = vVar57.x;
          fVar31 = vVar57.y;
          uVar4 = extraout_XMM0_Dc_29;
          uVar19 = extraout_XMM0_Dd_29;
        }
        local_288._4_4_ = fVar31;
        local_288._0_4_ = fVar16;
        uStack_280 = uVar4;
        uStack_27c = uVar19;
        local_268._4_4_ = fVar29;
        local_268._0_4_ = fVar14;
        uStack_260 = uVar53;
        uStack_25c = uVar54;
        color_02.y = fVar29;
        color_02.x = fVar14;
        color_02.w = fVar52;
        color_02.z = fVar20;
        _add_line(draw_list,(vec2)local_2c8,(vec2)local_2d8,fVar16,color_02);
        vVar34 = vec2_sub((vec2)local_2d8,(vec2)local_2c8);
        vVar34 = vec2_normalize(vVar34);
        uStack_2c0 = extraout_XMM0_Dc_30;
        local_2c8._0_4_ = vVar34.x;
        local_2c8._4_4_ = vVar34.y;
        uStack_2bc = extraout_XMM0_Dd_30;
        vVar34 = vec2_rotate(vVar34,1.5707964);
        uStack_290 = extraout_XMM0_Dc_31;
        local_298._0_4_ = vVar34.x;
        local_298._4_4_ = vVar34.y;
        uStack_28c = extraout_XMM0_Dd_31;
        vVar34 = vec2_scale((vec2)local_2c8,-6.4951906);
        local_238._8_4_ = extraout_XMM0_Dc_32;
        local_238._0_4_ = vVar34.x;
        local_238._4_4_ = vVar34.y;
        local_238._12_4_ = extraout_XMM0_Dd_32;
        vVar34 = vec2_scale((vec2)local_298,-7.5);
        vVar34 = vec2_add((vec2)local_238._0_8_,vVar34);
        vVar34 = vec2_add((vec2)local_2d8,vVar34);
        local_238._8_4_ = extraout_XMM0_Dc_33;
        local_238._0_4_ = vVar34.x;
        local_238._4_4_ = vVar34.y;
        local_238._12_4_ = extraout_XMM0_Dd_33;
        vVar34 = vec2_scale((vec2)local_2c8,-6.4951906);
        local_188._8_4_ = extraout_XMM0_Dc_34;
        local_188._0_4_ = vVar34.x;
        local_188._4_4_ = vVar34.y;
        local_188._12_4_ = extraout_XMM0_Dd_34;
        vVar34 = vec2_scale((vec2)local_298,7.5);
        vVar34 = vec2_add((vec2)local_188._0_8_,vVar34);
        vVar34 = vec2_add((vec2)local_2d8,vVar34);
        uStack_290 = extraout_XMM0_Dc_35;
        local_298._0_4_ = vVar34.x;
        local_298._4_4_ = vVar34.y;
        uStack_28c = extraout_XMM0_Dd_35;
        vVar34 = vec2_scale((vec2)local_2c8,6.4951906);
        vVar34 = vec2_add((vec2)local_2d8,vVar34);
        uStack_2d0 = extraout_XMM0_Dc_36;
        local_2d8._0_4_ = vVar34.x;
        local_2d8._4_4_ = vVar34.y;
        uStack_2cc = extraout_XMM0_Dd_36;
        col_01.z = (float)uVar59;
        col_01.w = SUB84(uVar59,4);
        col_01.x = (float)uVar58;
        col_01.y = SUB84(uVar58,4);
        IVar39 = igGetColorU32_Vec4(col_01);
        ImDrawList_AddTriangleFilled
                  (draw_list,(ImVec2)local_238._0_8_,(ImVec2)local_298,(ImVec2)local_2d8,IVar39);
        pfVar50 = pfVar50 + 4;
        pfVar48 = pfVar48 + 3;
      }
    }
  }
  return;
}

Assistant:

void golf_gizmo_update(golf_gizmo_t *gizmo, ImDrawList *draw_list) {
    if (!gizmo->is_on) {
        return;
    }

    golf_inputs_t *inputs = golf_inputs_get();
    golf_graphics_t *graphics = golf_graphics_get();

    vec3 p = gizmo->transform.position;
    float dist_modifier = 0.1f * vec3_distance(graphics->cam_pos, p);

    mat4 model_mat = mat4_from_quat(gizmo->transform.rotation);
    vec3 axis[3] = {
        vec3_apply_mat4(V3(1, 0, 0), 0, model_mat),
        vec3_apply_mat4(V3(0, 1, 0), 0, model_mat),
        vec3_apply_mat4(V3(0, 0, 1), 0, model_mat),
    };
    vec4 color[3] = { 
        V4(1, 0, 0, 1),
        V4(0, 1, 0, 1),
        V4(0, 0, 1, 1) 
    };

    if (gizmo->operation == GOLF_GIZMO_TRANSLATE) {
        int closest_axis = -1;
        float closest_dist = FLT_MAX;
        vec3 closest_point[3];
        for (int i = 0; i < 3; i++) {
            vec3 p1 = inputs->mouse_ray_orig;
            vec3 q1 = vec3_add(p1, inputs->mouse_ray_dir);
            vec3 p2 = p;
            vec3 q2 = vec3_add(p2, vec3_scale(axis[i], dist_modifier));
            float s, t;
            vec3 c1, c2;
            closest_point_ray_ray(p1, q1, p2, q2, &s, &t, &c1, &c2);
            float screen_dist = vec2_distance(_world_to_screen(c1), _world_to_screen(c2));
            if (t >= 0 && t <= 1.4f && screen_dist < closest_dist) {
                closest_dist = screen_dist;
                closest_axis = i;
            }
            closest_point[i] = c2;
        }

        int hovered_axis = -1;
        if (closest_dist < 8) {
            hovered_axis = closest_axis;
        }

        if (gizmo->is_active) {
            igCaptureMouseFromApp(true);
            if (!inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = false;
            }

            int axis_i = gizmo->translate.axis;
            vec3 translate = vec3_sub(closest_point[axis_i], gizmo->translate.start_point);
            float dist = golf_snapf(vec3_length(translate), gizmo->translate.snap);
            translate = vec3_set_length(translate, dist);
            gizmo->transform.position = vec3_add(gizmo->translate.start_position, translate);
            gizmo->delta_transform.position = translate;
        }
        else {
            if (hovered_axis >= 0 && inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = true;
                gizmo->translate.axis = hovered_axis;
                gizmo->translate.start_point = closest_point[hovered_axis];
                gizmo->translate.start_position = gizmo->transform.position;
                gizmo->delta_transform = golf_transform(V3(0, 0, 0), V3(0, 0, 0), QUAT(0, 0, 0, 1));
            }
        }

        for (int i = 0; i < 3; i++) {
            vec2 p0 = _world_to_screen(p);
            vec2 p1 = _world_to_screen(vec3_add(p, vec3_scale(axis[i], dist_modifier)));
            float thickness = 4;
            vec4 col = color[i];
            if ((!gizmo->is_active && hovered_axis == i) ||
                    (gizmo->is_active && i == gizmo->translate.axis)){
                col = V4(1, 1, 0, 1);
            }
            _add_line(draw_list, p0, p1, thickness, col);

            float w = 15;
            float h = sqrtf(3.0f) / 2.0f * w;
            vec2 dir0 = vec2_normalize(vec2_sub(p1, p0));
            vec2 dir1 = vec2_rotate(dir0, 0.5f * MF_PI);
            vec2 t_p0 = vec2_add(p1, vec2_add(vec2_scale(dir0, -0.5f * h), vec2_scale(dir1, -0.5f * w)));
            vec2 t_p1 = vec2_add(p1, vec2_add(vec2_scale(dir0, -0.5f * h), vec2_scale(dir1, 0.5f * w)));
            vec2 t_p2 = vec2_add(p1, vec2_scale(dir0, 0.5f * h));
            _add_triangle(draw_list, t_p0, t_p1, t_p2, col);
        }
    }
    else if (gizmo->operation == GOLF_GIZMO_ROTATE) {
        vec3 ro = inputs->mouse_ray_orig;
        vec3 rd = inputs->mouse_ray_dir;
        vec3 cc = p;
        float cr = 1 * dist_modifier;

        vec3 circle_p0[3], circle_p[3];
        int closest_axis = -1;
        float closest_dist = FLT_MAX;
        for (int i = 0; i < 3; i++) {
            circle_p0[i] = closest_point_point_plane(ro, cc, axis[i]);
            circle_p0[i] = vec3_add(cc, vec3_set_length(vec3_sub(circle_p0[i], cc), cr));

            float t;
            int idx;
            if (!ray_intersect_planes(ro, rd, &cc, &axis[i], 1, &t, &idx)) {
                continue;
            }

            vec3 plane_p = vec3_add(ro, vec3_scale(rd, t));
            circle_p[i] = vec3_add(cc, vec3_set_length(vec3_sub(plane_p, cc), cr));

            quat r = quat_between_vectors(vec3_sub(circle_p0[i], cc), vec3_sub(circle_p[i], cc));
            vec3 r_axis;
            float r_angle;
            quat_get_axis_angle(r, &r_axis, &r_angle);
            if (r_angle > 0.5f * MF_PI || r_angle < -0.5f * MF_PI) {
                continue;
            }

            float screen_dist = vec2_distance(_world_to_screen(plane_p), _world_to_screen(circle_p[i]));
            if (screen_dist < closest_dist) {
                closest_axis = i;
                closest_dist = screen_dist;
            }
        }

        float hover_dist = 8;
        int hovered_axis = -1;
        if (closest_dist < hover_dist) {
            hovered_axis = closest_axis;
        }

        if (gizmo->is_active) {
            igCaptureMouseFromApp(true);
            if (!inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = false;
            }

            int axis_i = gizmo->rotate.axis;
            vec3 dir0 = vec3_normalize(vec3_sub(gizmo->rotate.start_point, cc));
            vec3 dir1 = vec3_normalize(vec3_sub(circle_p[axis_i], cc));
            quat r = quat_between_vectors(dir0, dir1);
            vec3 r_axis;
            float r_angle;
            quat_get_axis_angle(r, &r_axis, &r_angle);

            if (r_angle != 0) {
                if (vec3_dot(r_axis, gizmo->rotate.axis_rotation) < 0.0f) {
                    r_angle *= -1.0f;
                }
                r_angle = golf_snapf(r_angle, gizmo->rotate.snap * (MF_PI / 180.0f));
                quat rotation = quat_create_from_axis_angle(gizmo->rotate.axis_rotation, r_angle);
                gizmo->transform.rotation = quat_multiply(rotation, gizmo->rotate.start_rotation);
                gizmo->delta_transform.rotation = rotation;
            }

            int num_points = 25;
            vec2 points[25];
            points[0] = _world_to_screen(cc);
            for (int i = 1; i < num_points; i++) {
                float t = r_angle * ((float)(i - 1) / (num_points - 2));
                vec3 p = vec3_add(cc, vec3_scale(vec3_rotate_about_axis(dir0, gizmo->rotate.axis_rotation, t), cr));
                points[i] = _world_to_screen(p);
            }
            vec4 col = V4(1, 1, 1, 0.4f);
            _add_convex_poly(draw_list, points, num_points, col);
        }
        else {
            if (hovered_axis >= 0 && inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = true;
                gizmo->rotate.axis = hovered_axis;
                gizmo->rotate.axis_rotation = axis[hovered_axis];
                gizmo->rotate.start_point = circle_p[hovered_axis];
                gizmo->rotate.start_rotation = gizmo->transform.rotation;
                gizmo->delta_transform = golf_transform(V3(0, 0, 0), V3(0, 0, 0), QUAT(0, 0, 0, 1));
            }
        }

        for (int i = 0; i < 3; i++) {
            vec4 col = color[i];
            if ((!gizmo->is_active && i == hovered_axis) ||
                    (gizmo->is_active && i == gizmo->rotate.axis)) {
                col = V4(1, 1, 0, 1);
            }
            float thickness = 4;
            int n = 20;
            vec3 pt = circle_p0[i];
            for (int j = 0; j < n; j++) {
                float t0 = 0.5f * MF_PI * ((float) j / n);
                float t1 = 0.5f * MF_PI * ((float) (j + 1) / n);
                vec3 dir = vec3_sub(pt, cc);
                vec2 p0 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], t0)));
                vec2 p1 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], t1)));
                _add_line(draw_list, p0, p1, thickness, col); 

                p0 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], -t0)));
                p1 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], -t1)));
                _add_line(draw_list, p0, p1, thickness, col); 
            }
        }
    }
    else if (gizmo->operation == GOLF_GIZMO_SCALE) {
        int closest_axis = -1;
        float closest_dist = FLT_MAX;
        vec3 closest_point[3];
        for (int i = 0; i < 3; i++) {
            vec3 p1 = inputs->mouse_ray_orig;
            vec3 q1 = vec3_add(p1, inputs->mouse_ray_dir);
            vec3 p2 = p;
            vec3 q2 = vec3_add(p2, vec3_scale(axis[i], dist_modifier));
            float s, t;
            vec3 c1, c2;
            closest_point_ray_ray(p1, q1, p2, q2, &s, &t, &c1, &c2);
            float screen_dist = vec2_distance(_world_to_screen(c1), _world_to_screen(c2));
            if (t >= 0 && t <= 1.4f && screen_dist < closest_dist) {
                closest_dist = screen_dist;
                closest_axis = i;
            }
            closest_point[i] = c2;
        }

        int hovered_axis = -1;
        if (closest_dist < 8) {
            hovered_axis = closest_axis;
        }

        if (gizmo->is_active) {
            igCaptureMouseFromApp(true);
            if (!inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = false;
            }

            int axis_i = gizmo->scale.axis;
            vec3 scale = vec3_sub(closest_point[axis_i], gizmo->scale.start_point);
            scale = vec3_snap(scale, gizmo->scale.snap);
            gizmo->transform.scale = vec3_add(gizmo->scale.start_scale, scale);
            gizmo->delta_transform.scale = scale;
        }
        else {
            if (hovered_axis >= 0 && inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = true;
                gizmo->scale.axis = hovered_axis;
                gizmo->scale.start_point = closest_point[hovered_axis];
                gizmo->scale.start_scale = gizmo->transform.scale;
                gizmo->delta_transform = golf_transform(V3(0, 0, 0), V3(0, 0, 0), QUAT(0, 0, 0, 1));
            }
        }

        for (int i = 0; i < 3; i++) {
            vec2 p0 = _world_to_screen(p);
            vec2 p1 = _world_to_screen(vec3_add(p, vec3_scale(axis[i], dist_modifier)));
            float thickness = 4;
            vec4 col = color[i];
            if ((!gizmo->is_active && hovered_axis == i) ||
                    (gizmo->is_active && i == gizmo->scale.axis)){
                col = V4(1, 1, 0, 1);
            }
            _add_line(draw_list, p0, p1, thickness, col);

            float r = 7.5;
            _add_circle(draw_list, p1, r, col);
        }
    }
}